

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::UnicodeString::unescape(UnicodeString *__return_storage_ptr__,UnicodeString *this)

{
  UBool UVar1;
  int32_t capacity;
  UChar32 srcChar;
  long lVar2;
  int iVar3;
  int32_t *offset;
  int32_t local_44;
  UChar32 c;
  int32_t i;
  int32_t prev;
  int32_t len;
  UChar *array;
  undefined1 local_19;
  UnicodeString *local_18;
  UnicodeString *this_local;
  UnicodeString *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = __return_storage_ptr__;
  capacity = length(this);
  UnicodeString(__return_storage_ptr__,capacity,0,0);
  UVar1 = isBogus(__return_storage_ptr__);
  if (UVar1 == '\0') {
    _prev = getBuffer(this);
    i = length(this);
    c = 0;
    local_44 = 0;
    while (local_44 != i) {
      iVar3 = local_44 + 1;
      lVar2 = (long)local_44;
      local_44 = iVar3;
      if (_prev[lVar2] == L'\\') {
        append(__return_storage_ptr__,_prev,c,~c + iVar3);
        offset = &local_44;
        srcChar = unescapeAt(this,offset);
        if (srcChar < 0) {
          remove(__return_storage_ptr__,(char *)offset);
          return __return_storage_ptr__;
        }
        append(__return_storage_ptr__,srcChar);
        c = local_44;
      }
    }
    append(__return_storage_ptr__,_prev,c,i - c);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString UnicodeString::unescape() const {
    UnicodeString result(length(), (UChar32)0, (int32_t)0); // construct with capacity
    if (result.isBogus()) {
        return result;
    }
    const UChar *array = getBuffer();
    int32_t len = length();
    int32_t prev = 0;
    for (int32_t i=0;;) {
        if (i == len) {
            result.append(array, prev, len - prev);
            break;
        }
        if (array[i++] == 0x5C /*'\\'*/) {
            result.append(array, prev, (i - 1) - prev);
            UChar32 c = unescapeAt(i); // advances i
            if (c < 0) {
                result.remove(); // return empty string
                break; // invalid escape sequence
            }
            result.append(c);
            prev = i;
        }
    }
    return result;
}